

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_pad(ggml_context *ctx,ggml_tensor *a,int p0,int p1,int p2,int p3)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_new_tensor_4d(ctx,a->type,(long)p0 + a->ne[0],(long)p1 + a->ne[1],
                              (long)p2 + a->ne[2],(long)p3 + a->ne[3]);
  pgVar1->op = GGML_OP_PAD;
  pgVar1->src[0] = a;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_pad(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   p0,
        int                   p1,
        int                   p2,
        int                   p3) {
    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type,
            a->ne[0] + p0,
            a->ne[1] + p1,
            a->ne[2] + p2,
            a->ne[3] + p3);

    result->op     = GGML_OP_PAD;
    result->src[0] = a;

    return result;
}